

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVLD4LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint *Decoder_00;
  void *Decoder_01;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t Address_03;
  uint64_t extraout_RDX;
  uint64_t Address_04;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint64_t uVar3;
  uint64_t Address_05;
  uint64_t Address_06;
  uint64_t Address_07;
  int iVar4;
  uint RegNo;
  uint RegNo_00;
  uint RegNo_01;
  uint RegNo_02;
  uint uVar5;
  uint uVar6;
  DecodeStatus local_40;
  
  local_40 = MCDisassembler_Fail;
  Decoder_00 = &switchD_00150e53::switchdataD_001ca1f0;
  switch(Insn >> 10 & 3) {
  case 0:
    uVar5 = Insn >> 2 & 4;
    uVar6 = Insn >> 5 & 7;
    iVar4 = 1;
    goto LAB_00150ec7;
  case 1:
    uVar5 = Insn >> 1 & 8;
    uVar6 = Insn >> 6 & 3;
    uVar1 = Insn & 0x20;
    break;
  case 2:
    uVar5 = Insn >> 4 & 3;
    if ((Insn >> 4 & 3) != 0) {
      if (uVar5 == 3) {
        return MCDisassembler_Fail;
      }
      Decoder_00 = (uint *)(ulong)uVar5;
      uVar5 = 4 << (sbyte)uVar5;
    }
    uVar6 = Insn >> 7 & 1;
    uVar1 = Insn & 0x40;
    break;
  case 3:
    goto switchD_00150e53_caseD_3;
  }
  iVar4 = 2 - (uint)(uVar1 == 0);
LAB_00150ec7:
  uVar1 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  local_40 = DecodeDPRRegisterClass(Inst,uVar1,Address,Decoder_00);
  Decoder_01 = (void *)(ulong)(local_40 | 2);
  if ((local_40 | 2) == MCDisassembler_Success) {
    DVar2 = DecodeDPRRegisterClass(Inst,iVar4 + uVar1,Address_00,Decoder_01);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) goto LAB_00151082;
      local_40 = MCDisassembler_SoftFail;
    }
    RegNo_02 = uVar1 + iVar4 * 2;
    DVar2 = DecodeDPRRegisterClass(Inst,RegNo_02,Address_01,Decoder_01);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) goto LAB_00151082;
      local_40 = MCDisassembler_SoftFail;
    }
    RegNo = iVar4 * 3 + uVar1;
    DVar2 = DecodeDPRRegisterClass(Inst,RegNo,Address_02,Decoder_01);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) goto LAB_00151082;
      local_40 = MCDisassembler_SoftFail;
    }
    RegNo_00 = Insn >> 0x10 & 0xf;
    RegNo_01 = Insn & 0xf;
    uVar3 = Address_03;
    if ((RegNo_01 != 0xf) &&
       (DVar2 = DecodeGPRRegisterClass(Inst,RegNo_00,Address_03,Decoder_01), uVar3 = extraout_RDX,
       DVar2 != MCDisassembler_Success)) {
      if (DVar2 != MCDisassembler_SoftFail) goto LAB_00151082;
      local_40 = MCDisassembler_SoftFail;
    }
    DVar2 = DecodeGPRRegisterClass(Inst,RegNo_00,uVar3,Decoder_01);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) goto LAB_00151082;
      local_40 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar5);
    uVar3 = Address_04;
    if (RegNo_01 != 0xf) {
      if (RegNo_01 == 0xd) {
        MCOperand_CreateReg0(Inst,0);
        uVar3 = extraout_RDX_00;
      }
      else {
        DVar2 = DecodeGPRRegisterClass(Inst,RegNo_01,Address_04,Decoder_01);
        uVar3 = extraout_RDX_01;
        if (DVar2 != MCDisassembler_Success) {
          if (DVar2 != MCDisassembler_SoftFail) goto LAB_00151082;
          local_40 = MCDisassembler_SoftFail;
        }
      }
    }
    DVar2 = DecodeDPRRegisterClass(Inst,uVar1,uVar3,Decoder_01);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_40 = MCDisassembler_SoftFail;
    }
    DVar2 = DecodeDPRRegisterClass(Inst,iVar4 + uVar1,Address_05,Decoder_01);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_40 = MCDisassembler_SoftFail;
    }
    DVar2 = DecodeDPRRegisterClass(Inst,RegNo_02,Address_06,Decoder_01);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_40 = MCDisassembler_SoftFail;
    }
    DVar2 = DecodeDPRRegisterClass(Inst,RegNo,Address_07,Decoder_01);
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      local_40 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,(ulong)uVar6);
  }
  else {
LAB_00151082:
    local_40 = MCDisassembler_Fail;
  }
switchD_00150e53_caseD_3:
  return local_40;
}

Assistant:

static DecodeStatus DecodeVLD4LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0, inc = 1;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 4;
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 8;
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 5, 1))
				inc = 2;
			break;
		case 2:
			switch (fieldFromInstruction_4(Insn, 4, 2)) {
				case 0:
					align = 0; break;
				case 3:
					return MCDisassembler_Fail;
				default:
					align = 4 << fieldFromInstruction_4(Insn, 4, 2); break;
			}

			index = fieldFromInstruction_4(Insn, 7, 1);
			if (fieldFromInstruction_4(Insn, 6, 1))
				inc = 2;
			break;
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+3*inc, Address, Decoder)))
		return MCDisassembler_Fail;

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+2*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd+3*inc, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}